

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O3

int BN_ext_count_low_zero_bits(BIGNUM *bn)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
  CVar5;
  FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_> bytes;
  S2LogMessage local_130;
  Storage local_120;
  
  iVar3 = BN_num_bits((BIGNUM *)bn);
  iVar4 = iVar3 + 0xe;
  if (-1 < iVar3 + 7) {
    iVar4 = iVar3 + 7;
  }
  local_120.size_alloc_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
  .
  super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
  .value = (CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
            )(long)(iVar4 >> 3);
  local_120.data_ =
       absl::FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_>::
       Storage::InitializeData(&local_120);
  iVar4 = BN_bn2lebinpad(bn,local_120.data_,
                         (ulong)local_120.size_alloc_.
                                super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
                                .
                                super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
                                .value & 0xffffffff);
  if (local_120.size_alloc_.
      super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
      .
      super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
      .value != (CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
                 )(long)iVar4) {
    S2LogMessage::S2LogMessage
              (&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
               ,0x8b,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_130.stream_,
               "Check failed: (BN_bn2lebinpad(bn, bytes.data(), bytes.size())) == (bytes.size()) ",
               0x51);
    abort();
  }
  if (local_120.size_alloc_.
      super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
      .
      super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
      .value == (Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
                 )0x0) {
    return 0;
  }
  iVar4 = (int)local_120.size_alloc_.
               super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
               .
               super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
               .value * 8;
  CVar5.
  super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
  .value = (Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
            )0;
  iVar3 = 0;
  while (bVar1 = local_120.data_
                 [(long)CVar5.
                        super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
                        .value], bVar1 == 0) {
    iVar3 = iVar3 + 8;
    CVar5.
    super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
    .value = (Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
              )((long)CVar5.
                      super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
                      .value + 1);
    if (local_120.size_alloc_.
        super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
        .
        super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
        .value == (CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
                   )CVar5.
                    super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
                    .value) goto LAB_00232b51;
  }
  bVar2 = bVar1 & 1;
  iVar4 = iVar3;
  while (bVar2 == 0) {
    iVar4 = iVar4 + 1;
    bVar2 = bVar1 & 2;
    bVar1 = bVar1 >> 1;
  }
LAB_00232b51:
  if ((ulong)local_120.size_alloc_.
             super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
             .
             super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
             .value < 0x101) {
    return iVar4;
  }
  operator_delete(local_120.data_);
  return iVar4;
}

Assistant:

static int BN_ext_count_low_zero_bits(const BIGNUM* bn) {
  // In OpenSSL >= 1.1, BIGNUM is an opaque type, so d and top
  // cannot be accessed.  The bytes must be copied out at a ~25%
  // performance penalty.
  absl::FixedArray<unsigned char> bytes(BN_num_bytes(bn));
  // "le" indicates little endian.
  S2_CHECK_EQ(BN_bn2lebinpad(bn, bytes.data(), bytes.size()), bytes.size());

  int count = 0;
  for (unsigned char c : bytes) {
    if (c == 0) {
      count += 8;
    } else {
      for (; (c & 1) == 0; c >>= 1) {
        ++count;
      }
      break;
    }
  }
  return count;
}